

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::_PathArcToFastEx
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_sample,int a_max_sample,int a_step
          )

{
  ImVec2 IVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  float local_70;
  float fStack_6c;
  ImVec2 s_2;
  int normalized_max_sample;
  ImVec2 s_1;
  int a_1;
  ImVec2 s;
  int a;
  int sample_index;
  ImVec2 *out_ptr;
  int overstep;
  bool extra_max_sample;
  int samples;
  int a_next_step;
  int sample_range;
  int a_step_local;
  int a_max_sample_local;
  int a_min_sample_local;
  float radius_local;
  ImVec2 *center_local;
  ImDrawList *this_local;
  
  if (0.5 <= radius) {
    a_next_step = a_step;
    if (a_step < 1) {
      iVar3 = _CalcCircleAutoSegmentCount(this,radius);
      a_next_step = (int)(0x30 / (long)iVar3);
    }
    iVar3 = ImClamp<int>(a_next_step,1,0xc);
    iVar4 = ImAbs(a_max_sample - a_min_sample);
    overstep = iVar4 + 1;
    bVar2 = false;
    a_next_step = iVar3;
    if (1 < iVar3) {
      overstep = iVar4 / iVar3 + 1;
      if (0 < iVar4 % iVar3) {
        bVar2 = true;
        overstep = iVar4 / iVar3 + 2;
        if (0 < iVar4) {
          a_next_step = iVar3 - (iVar3 - iVar4 % iVar3) / 2;
        }
      }
    }
    ImVector<ImVec2>::resize(&this->_Path,(this->_Path).Size + overstep);
    _a = (this->_Path).Data + ((this->_Path).Size - overstep);
    if (((a_min_sample < 0) || (s.y = (float)a_min_sample, 0x2f < a_min_sample)) &&
       (s.y = (float)(a_min_sample % 0x30), (int)s.y < 0)) {
      s.y = (float)((int)s.y + 0x30);
    }
    s_1.x = (float)a_min_sample;
    s.x = (float)a_min_sample;
    if (a_max_sample < a_min_sample) {
      while (a_max_sample <= (int)s_1.x) {
        if ((int)s.y < 0) {
          s.y = (float)((int)s.y + 0x30);
        }
        IVar1 = this->_Data->ArcFastVtx[(int)s.y];
        s_2.y = IVar1.x;
        _a->x = s_2.y * radius + center->x;
        normalized_max_sample = (int)IVar1.y;
        _a->y = (float)normalized_max_sample * radius + center->y;
        _a = _a + 1;
        s.y = (float)((int)s.y - a_next_step);
        s_1.x = (float)((int)s_1.x - a_next_step);
        a_next_step = iVar3;
      }
    }
    else {
      while ((int)s.x <= a_max_sample) {
        if (0x2f < (int)s.y) {
          s.y = (float)((int)s.y + -0x30);
        }
        IVar1 = this->_Data->ArcFastVtx[(int)s.y];
        s_1.y = IVar1.x;
        _a->x = s_1.y * radius + center->x;
        a_1 = (int)IVar1.y;
        _a->y = (float)a_1 * radius + center->y;
        _a = _a + 1;
        s.y = (float)(a_next_step + (int)s.y);
        s.x = (float)(a_next_step + (int)s.x);
        a_next_step = iVar3;
      }
    }
    if (bVar2) {
      s_2.x = (float)(a_max_sample % 0x30);
      if ((int)s_2.x < 0) {
        s_2.x = (float)((int)s_2.x + 0x30);
      }
      IVar1 = this->_Data->ArcFastVtx[(int)s_2.x];
      local_70 = IVar1.x;
      _a->x = local_70 * radius + center->x;
      fStack_6c = IVar1.y;
      _a->y = fStack_6c * radius + center->y;
    }
  }
  else {
    ImVector<ImVec2>::push_back(&this->_Path,center);
  }
  return;
}

Assistant:

void ImDrawList::_PathArcToFastEx(const ImVec2& center, float radius, int a_min_sample, int a_max_sample, int a_step)
{
    if (radius < 0.5f)
    {
        _Path.push_back(center);
        return;
    }

    // Calculate arc auto segment step size
    if (a_step <= 0)
        a_step = IM_DRAWLIST_ARCFAST_SAMPLE_MAX / _CalcCircleAutoSegmentCount(radius);

    // Make sure we never do steps larger than one quarter of the circle
    a_step = ImClamp(a_step, 1, IM_DRAWLIST_ARCFAST_TABLE_SIZE / 4);

    const int sample_range = ImAbs(a_max_sample - a_min_sample);
    const int a_next_step = a_step;

    int samples = sample_range + 1;
    bool extra_max_sample = false;
    if (a_step > 1)
    {
        samples            = sample_range / a_step + 1;
        const int overstep = sample_range % a_step;

        if (overstep > 0)
        {
            extra_max_sample = true;
            samples++;

            // When we have overstep to avoid awkwardly looking one long line and one tiny one at the end,
            // distribute first step range evenly between them by reducing first step size.
            if (sample_range > 0)
                a_step -= (a_step - overstep) / 2;
        }
    }

    _Path.resize(_Path.Size + samples);
    ImVec2* out_ptr = _Path.Data + (_Path.Size - samples);

    int sample_index = a_min_sample;
    if (sample_index < 0 || sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
    {
        sample_index = sample_index % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (sample_index < 0)
            sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
    }

    if (a_max_sample >= a_min_sample)
    {
        for (int a = a_min_sample; a <= a_max_sample; a += a_step, sample_index += a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
                sample_index -= IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }
    else
    {
        for (int a = a_min_sample; a >= a_max_sample; a -= a_step, sample_index -= a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index < 0)
                sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }

    if (extra_max_sample)
    {
        int normalized_max_sample = a_max_sample % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (normalized_max_sample < 0)
            normalized_max_sample += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

        const ImVec2 s = _Data->ArcFastVtx[normalized_max_sample];
        out_ptr->x = center.x + s.x * radius;
        out_ptr->y = center.y + s.y * radius;
        out_ptr++;
    }

    IM_ASSERT_PARANOID(_Path.Data + _Path.Size == out_ptr);
}